

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

double __thiscall llvm::APInt::sqrt(APInt *this,double __x)

{
  uint uVar1;
  long lVar2;
  anon_union_8_2_1313ab2f_for_U aVar3;
  anon_union_8_2_1313ab2f_for_U aVar4;
  anon_union_8_2_1313ab2f_for_U *paVar5;
  int iVar6;
  uint uVar7;
  uint64_t val;
  ulong uVar8;
  APInt *in_RSI;
  anon_union_8_2_1313ab2f_for_U *RHS;
  double dVar9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  APInt square;
  APInt nextSquare;
  APInt midpoint;
  APInt testy;
  APInt two;
  APInt offset;
  APInt x_new;
  anon_union_8_2_1313ab2f_for_U local_120;
  uint local_118;
  anon_union_8_2_1313ab2f_for_U local_110;
  uint local_108;
  anon_union_8_2_1313ab2f_for_U local_100;
  uint local_f8;
  APInt *local_f0;
  anon_union_8_2_1313ab2f_for_U local_e8;
  uint local_e0;
  anon_union_8_2_1313ab2f_for_U local_d8;
  uint local_d0;
  anon_union_8_2_1313ab2f_for_U local_c8;
  uint local_c0;
  anon_union_8_2_1313ab2f_for_U local_b8;
  uint local_b0;
  anon_union_8_2_1313ab2f_for_U local_a8;
  uint local_a0;
  anon_union_8_2_1313ab2f_for_U local_98;
  uint local_90;
  anon_union_8_2_1313ab2f_for_U local_88;
  uint local_80;
  anon_union_8_2_1313ab2f_for_U *local_78;
  anon_union_8_2_1313ab2f_for_U local_70;
  uint local_68;
  anon_union_8_2_1313ab2f_for_U local_60;
  uint local_58;
  anon_union_8_2_1313ab2f_for_U local_50;
  uint local_48;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  uVar1 = in_RSI->BitWidth;
  if (uVar1 < 0x41) {
    uVar8 = (in_RSI->U).VAL;
    if (uVar8 == 0) {
      uVar7 = 0x40;
    }
    else {
      lVar2 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar7 = (uint)lVar2 ^ 0x3f;
    }
    uVar7 = (uVar1 - 0x40) + uVar7;
  }
  else {
    uVar7 = countLeadingZerosSlowCase(in_RSI);
  }
  if (uVar1 - uVar7 < 6) {
    if (0x40 < uVar1) {
      in_RSI = (APInt *)(in_RSI->U).VAL;
    }
    val = (uint64_t)""[(in_RSI->U).VAL];
  }
  else {
    if (0x33 < uVar1 - uVar7) {
      APInt((APInt *)&local_d8,uVar1,0x10,false);
      APInt((APInt *)&local_110,in_RSI->BitWidth,1,false);
      APInt((APInt *)&local_40,in_RSI->BitWidth,0,false);
      APInt((APInt *)&local_88,in_RSI->BitWidth,2,false);
      uVar7 = 2;
      local_f0 = in_RSI;
      if (4 < uVar1) {
        uVar7 = 4;
        do {
          iVar6 = compare(in_RSI,(APInt *)&local_d8);
          if (iVar6 < 1) break;
          local_118 = local_d0;
          if ((ulong)local_d0 < 0x41) {
            local_120.VAL = local_d8.VAL;
          }
          else {
            uVar8 = (ulong)((uint)((ulong)local_d0 + 0x3f >> 3) & 0xfffffff8);
            local_120.pVal = (uint64_t *)operator_new__(uVar8);
            memcpy(local_120.pVal,local_d8.pVal,uVar8);
          }
          operator<<=((APInt *)&local_120,2);
          operator=((APInt *)&local_d8,(APInt *)&local_120);
          in_RSI = local_f0;
          if ((0x40 < local_118) && ((void *)local_120.VAL != (void *)0x0)) {
            operator_delete__(local_120.pVal);
          }
          uVar7 = uVar7 + 2;
        } while (uVar7 < uVar1);
        uVar7 = uVar7 >> 1;
      }
      local_118 = local_108;
      if ((ulong)local_108 < 0x41) {
        local_120.VAL = local_110.VAL;
      }
      else {
        uVar8 = (ulong)((uint)((ulong)local_108 + 0x3f >> 3) & 0xfffffff8);
        local_120.pVal = (uint64_t *)operator_new__(uVar8);
        memcpy(local_120.pVal,local_110.pVal,uVar8);
      }
      local_78 = &this->U;
      operator<<=((APInt *)&local_120,uVar7);
      operator=((APInt *)&local_110,(APInt *)&local_120);
      if ((0x40 < local_118) && (local_120.VAL != 0)) {
        operator_delete__(local_120.pVal);
      }
      while( true ) {
        udiv((APInt *)&local_98,local_f0);
        operator+=((APInt *)&local_98,(APInt *)&local_110);
        local_f8 = local_90;
        local_100.VAL = local_98.VAL;
        local_90 = 0;
        udiv((APInt *)&local_120,(APInt *)&local_100);
        operator=((APInt *)&local_40,(APInt *)&local_120);
        if ((0x40 < local_118) && (local_120.VAL != 0)) {
          operator_delete__(local_120.pVal);
        }
        if ((0x40 < local_f8) && ((void *)local_100.VAL != (void *)0x0)) {
          operator_delete__(local_100.pVal);
        }
        if ((0x40 < local_90) && ((void *)local_98.VAL != (void *)0x0)) {
          operator_delete__(local_98.pVal);
        }
        iVar6 = compare((APInt *)&local_110,(APInt *)&local_40);
        if (iVar6 < 1) break;
        operator=((APInt *)&local_110,(APInt *)&local_40);
      }
      RHS = &local_110;
      operator*((APInt *)&local_120,(APInt *)RHS);
      local_a0 = local_108;
      if ((ulong)local_108 < 0x41) {
        local_a8.VAL = local_110.VAL;
      }
      else {
        uVar8 = (ulong)((uint)((ulong)local_108 + 0x3f >> 3) & 0xfffffff8);
        local_a8.pVal = (uint64_t *)operator_new__(uVar8);
        memcpy(local_a8.pVal,local_110.pVal,uVar8);
      }
      operator+=((APInt *)&local_a8,1);
      uVar1 = local_a0;
      aVar4 = local_a8;
      local_e0 = local_a0;
      local_e8.VAL = local_a8.VAL;
      local_a0 = 0;
      local_b0 = local_108;
      if ((ulong)local_108 < 0x41) {
        local_b8.VAL = local_110.VAL;
      }
      else {
        uVar8 = (ulong)((uint)((ulong)local_108 + 0x3f >> 3) & 0xfffffff8);
        local_b8.pVal = (uint64_t *)operator_new__(uVar8);
        memcpy(local_b8.pVal,local_110.pVal,uVar8);
      }
      operator+=((APInt *)&local_b8,1);
      uVar7 = local_b0;
      aVar3 = local_b8;
      local_48 = local_b0;
      local_50.VAL = local_b8.VAL;
      local_b0 = 0;
      operator*((APInt *)&local_100,(APInt *)&local_e8);
      if (aVar3.VAL != 0 && 0x40 < uVar7) {
        operator_delete__(aVar3.pVal);
      }
      paVar5 = local_78;
      if ((0x40 < local_b0) && (local_b8.VAL != 0)) {
        operator_delete__(local_b8.pVal);
      }
      if (aVar4.VAL != 0 && 0x40 < uVar1) {
        operator_delete__(aVar4.pVal);
      }
      if ((0x40 < local_a0) && (local_a8.VAL != 0)) {
        operator_delete__(local_a8.pVal);
      }
      iVar6 = compare(local_f0,(APInt *)&local_120);
      if (iVar6 < 0) {
        *(uint *)(paVar5 + 1) = local_108;
        *paVar5 = local_110;
        local_108 = 0;
        dVar9 = extraout_XMM0_Qa_00;
      }
      else {
        iVar6 = compare(local_f0,(APInt *)&local_100);
        if (0 < iVar6) {
          __assert_fail("this->ule(nextSquare) && \"Error in APInt::sqrt computation\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                        ,0x444,"APInt llvm::APInt::sqrt() const");
        }
        local_c0 = local_f8;
        if ((ulong)local_f8 < 0x41) {
          local_c8.VAL = local_100.VAL;
        }
        else {
          uVar8 = (ulong)((uint)((ulong)local_f8 + 0x3f >> 3) & 0xfffffff8);
          local_c8.pVal = (uint64_t *)operator_new__(uVar8);
          memcpy(local_c8.pVal,local_100.pVal,uVar8);
        }
        operator-=((APInt *)&local_c8,(APInt *)&local_120);
        local_48 = local_c0;
        local_50.VAL = local_c8.VAL;
        local_c0 = 0;
        udiv((APInt *)&local_e8,(APInt *)&local_50);
        if ((0x40 < local_48) && ((void *)local_50.VAL != (void *)0x0)) {
          operator_delete__(local_50.pVal);
        }
        if ((0x40 < local_c0) && ((void *)local_c8.VAL != (void *)0x0)) {
          operator_delete__(local_c8.pVal);
        }
        local_58 = local_f0->BitWidth;
        if ((ulong)local_58 < 0x41) {
          local_60.pVal = (local_f0->U).pVal;
        }
        else {
          uVar8 = (ulong)((uint)((ulong)local_58 + 0x3f >> 3) & 0xfffffff8);
          local_60.pVal = (uint64_t *)operator_new__(uVar8);
          memcpy(local_60.pVal,(local_f0->U).pVal,uVar8);
        }
        operator-=((APInt *)&local_60,(APInt *)&local_120);
        uVar1 = local_58;
        aVar4 = local_60;
        local_48 = local_58;
        local_50.VAL = local_60.VAL;
        local_58 = 0;
        iVar6 = compare((APInt *)&local_50,(APInt *)&local_e8);
        if (iVar6 < 0) {
          *(uint *)(paVar5 + 1) = local_108;
          dVar9 = extraout_XMM0_Qa_01;
        }
        else {
          local_68 = local_108;
          if (local_108 < 0x41) {
            local_70.VAL = local_110.VAL;
          }
          else {
            uVar8 = (ulong)((uint)((ulong)local_108 + 0x3f >> 3) & 0xfffffff8);
            local_70.pVal = (uint64_t *)operator_new__(uVar8);
            memcpy(local_70.pVal,local_110.pVal,uVar8);
          }
          RHS = &local_70;
          operator+=((APInt *)RHS,1);
          *(uint *)(paVar5 + 1) = local_68;
          dVar9 = extraout_XMM0_Qa_02;
        }
        *paVar5 = *RHS;
        *(uint *)(RHS + 1) = 0;
        if ((uint64_t *)aVar4.VAL != (uint64_t *)0x0 && 0x40 < uVar1) {
          operator_delete__(aVar4.pVal);
          dVar9 = extraout_XMM0_Qa_03;
        }
        if ((0x40 < local_e0) && (local_e8.VAL != 0)) {
          operator_delete__(local_e8.pVal);
          dVar9 = extraout_XMM0_Qa_04;
        }
      }
      if ((0x40 < local_f8) && ((void *)local_100.VAL != (void *)0x0)) {
        operator_delete__(local_100.pVal);
        dVar9 = extraout_XMM0_Qa_05;
      }
      if ((0x40 < local_118) && (local_120.VAL != 0)) {
        operator_delete__(local_120.pVal);
        dVar9 = extraout_XMM0_Qa_06;
      }
      if ((0x40 < local_80) && ((void *)local_88.VAL != (void *)0x0)) {
        operator_delete__(local_88.pVal);
        dVar9 = extraout_XMM0_Qa_07;
      }
      if ((0x40 < local_38) && ((void *)local_40.VAL != (void *)0x0)) {
        operator_delete__(local_40.pVal);
        dVar9 = extraout_XMM0_Qa_08;
      }
      if ((0x40 < local_108) && (local_110.VAL != 0)) {
        operator_delete__(local_110.pVal);
        dVar9 = extraout_XMM0_Qa_09;
      }
      if (local_d0 < 0x41) {
        return dVar9;
      }
      if ((void *)local_d8.VAL == (void *)0x0) {
        return dVar9;
      }
      operator_delete__(local_d8.pVal);
      return extraout_XMM0_Qa_10;
    }
    if (0x40 < uVar1) {
      in_RSI = (APInt *)(in_RSI->U).VAL;
    }
    dVar9 = round(SQRT(((double)CONCAT44(0x45300000,(int)((in_RSI->U).VAL >> 0x20)) -
                       1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)(in_RSI->U).VAL) - 4503599627370496.0)));
    val = (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9;
  }
  APInt(this,uVar1,val,false);
  return extraout_XMM0_Qa;
}

Assistant:

APInt APInt::sqrt() const {

  // Determine the magnitude of the value.
  unsigned magnitude = getActiveBits();

  // Use a fast table for some small values. This also gets rid of some
  // rounding errors in libc sqrt for small values.
  if (magnitude <= 5) {
    static const uint8_t results[32] = {
      /*     0 */ 0,
      /*  1- 2 */ 1, 1,
      /*  3- 6 */ 2, 2, 2, 2,
      /*  7-12 */ 3, 3, 3, 3, 3, 3,
      /* 13-20 */ 4, 4, 4, 4, 4, 4, 4, 4,
      /* 21-30 */ 5, 5, 5, 5, 5, 5, 5, 5, 5, 5,
      /*    31 */ 6
    };
    return APInt(BitWidth, results[ (isSingleWord() ? U.VAL : U.pVal[0]) ]);
  }

  // If the magnitude of the value fits in less than 52 bits (the precision of
  // an IEEE double precision floating point value), then we can use the
  // libc sqrt function which will probably use a hardware sqrt computation.
  // This should be faster than the algorithm below.
  if (magnitude < 52) {
    return APInt(BitWidth,
                 uint64_t(::round(::sqrt(double(isSingleWord() ? U.VAL
                                                               : U.pVal[0])))));
  }

  // Okay, all the short cuts are exhausted. We must compute it. The following
  // is a classical Babylonian method for computing the square root. This code
  // was adapted to APInt from a wikipedia article on such computations.
  // See http://www.wikipedia.org/ and go to the page named
  // Calculate_an_integer_square_root.
  unsigned nbits = BitWidth, i = 4;
  APInt testy(BitWidth, 16);
  APInt x_old(BitWidth, 1);
  APInt x_new(BitWidth, 0);
  APInt two(BitWidth, 2);

  // Select a good starting value using binary logarithms.
  for (;; i += 2, testy = testy.shl(2))
    if (i >= nbits || this->ule(testy)) {
      x_old = x_old.shl(i / 2);
      break;
    }

  // Use the Babylonian method to arrive at the integer square root:
  for (;;) {
    x_new = (this->udiv(x_old) + x_old).udiv(two);
    if (x_old.ule(x_new))
      break;
    x_old = x_new;
  }

  // Make sure we return the closest approximation
  // NOTE: The rounding calculation below is correct. It will produce an
  // off-by-one discrepancy with results from pari/gp. That discrepancy has been
  // determined to be a rounding issue with pari/gp as it begins to use a
  // floating point representation after 192 bits. There are no discrepancies
  // between this algorithm and pari/gp for bit widths < 192 bits.
  APInt square(x_old * x_old);
  APInt nextSquare((x_old + 1) * (x_old +1));
  if (this->ult(square))
    return x_old;
  assert(this->ule(nextSquare) && "Error in APInt::sqrt computation");
  APInt midpoint((nextSquare - square).udiv(two));
  APInt offset(*this - square);
  if (offset.ult(midpoint))
    return x_old;
  return x_old + 1;
}